

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokFileDesc::CTcTokFileDesc
          (CTcTokFileDesc *this,char *fname,size_t fname_len,int index,CTcTokFileDesc *orig_desc,
          char *orig_fname,size_t orig_fname_len)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  undefined4 in_ECX;
  char *in_RDI;
  char *in_R8;
  char *in_R9;
  char *rootname;
  char *in_stack_ffffffffffffffc8;
  wchar_t wVar4;
  undefined4 in_stack_ffffffffffffffe0;
  
  in_RDI[0x48] = '\0';
  in_RDI[0x49] = '\0';
  in_RDI[0x4a] = '\0';
  in_RDI[0x4b] = '\0';
  in_RDI[0x4c] = '\0';
  in_RDI[0x4d] = '\0';
  in_RDI[0x4e] = '\0';
  in_RDI[0x4f] = '\0';
  in_RDI[0x50] = '\0';
  in_RDI[0x51] = '\0';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  in_RDI[0x54] = '\0';
  in_RDI[0x55] = '\0';
  in_RDI[0x56] = '\0';
  in_RDI[0x57] = '\0';
  *(char **)(in_RDI + 0x40) = in_R8;
  in_RDI[0x38] = '\0';
  in_RDI[0x39] = '\0';
  in_RDI[0x3a] = '\0';
  in_RDI[0x3b] = '\0';
  in_RDI[0x3c] = '\0';
  in_RDI[0x3d] = '\0';
  in_RDI[0x3e] = '\0';
  in_RDI[0x3f] = '\0';
  *(undefined4 *)in_RDI = in_ECX;
  pcVar1 = lib_copy_str(in_stack_ffffffffffffffc8,(size_t)in_RDI);
  *(char **)(in_RDI + 8) = pcVar1;
  pcVar1 = lib_copy_str(in_stack_ffffffffffffffc8,(size_t)in_RDI);
  *(char **)(in_RDI + 0x10) = pcVar1;
  pcVar1 = os_get_root_name(in_RDI);
  wVar4 = (wchar_t)((ulong)pcVar1 >> 0x20);
  sVar2 = get_quoted_len(in_R9,wVar4);
  pvVar3 = malloc(sVar2 + 3);
  *(void **)(in_RDI + 0x18) = pvVar3;
  sVar2 = get_quoted_len(in_R9,wVar4);
  pvVar3 = malloc(sVar2 + 3);
  *(void **)(in_RDI + 0x20) = pvVar3;
  sVar2 = get_quoted_len(in_R9,wVar4);
  pvVar3 = malloc(sVar2 + 3);
  *(void **)(in_RDI + 0x30) = pvVar3;
  sVar2 = get_quoted_len(in_R9,wVar4);
  wVar4 = (wchar_t)((ulong)in_R9 >> 0x20);
  pvVar3 = malloc(sVar2 + 3);
  *(void **)(in_RDI + 0x28) = pvVar3;
  build_quoted_str((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,wVar4);
  build_quoted_str((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,wVar4);
  build_quoted_str((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,wVar4);
  build_quoted_str((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,wVar4);
  return;
}

Assistant:

CTcTokFileDesc::CTcTokFileDesc(const char *fname, size_t fname_len,
                               int index, CTcTokFileDesc *orig_desc,
                               const char *orig_fname, size_t orig_fname_len)
{
    const char *rootname;

    /* no source pages are allocated yet */
    src_pages_ = 0;
    src_pages_alo_ = 0;

    /* remember the first instance of this filename in the list */
    orig_ = orig_desc;

    /* there's nothing else in our chain yet */
    next_ = 0;

    /* remember my index in the master list */
    index_ = index;

    /* if there's a filename, save a copy of the name */
    fname_ = lib_copy_str(fname, fname_len);

    /* if there's an original filename save it as well */
    orig_fname_ = lib_copy_str(orig_fname, orig_fname_len);

    /* 
     *   get the root filename, since we need to build a quoted version of
     *   that as well as of the basic filename 
     */
    rootname = os_get_root_name(fname_);

    /* 
     *   Allocate space for the quoted versions of the filename - make room
     *   for the filename plus the quotes (one on each end) and a null
     *   terminator byte.
     */
    dquoted_fname_ = (char *)t3malloc(get_quoted_len(fname_, '"') + 3);
    squoted_fname_ = (char *)t3malloc(get_quoted_len(fname_, '\'') + 3);
    dquoted_rootname_ = (char *)t3malloc(get_quoted_len(rootname, '"') + 3);
    squoted_rootname_ = (char *)t3malloc(get_quoted_len(rootname, '\'') + 3);

    /* build the quoted version of the name */
    build_quoted_str(dquoted_fname_, fname_, '"');
    build_quoted_str(squoted_fname_, fname_, '\'');
    build_quoted_str(dquoted_rootname_, rootname, '"');
    build_quoted_str(squoted_rootname_, rootname, '\'');
}